

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O1

void __thiscall
TwoValuesWithHashCollision_LevelTenCollisionIterator_Test::TestBody
          (TwoValuesWithHashCollision_LevelTenCollisionIterator_Test *this)

{
  database *db;
  mutex_type *pmVar1;
  test_trie *ptVar2;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *phVar3;
  pointer pcVar4;
  uint generation;
  value_reference_type ppVar5;
  iterator_base<false> *piVar6;
  pointer *__ptr_2;
  pointer *__ptr;
  index_pointer node;
  char *pcVar7;
  AssertionResult gtest_ar_6;
  string v4;
  string v3;
  transaction_type t1;
  iterator begin;
  iterator end;
  AssertHelper local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  AssertHelper local_548;
  undefined1 local_540 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  AssertHelper local_520;
  undefined1 local_518 [8];
  index_pointer local_510;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508 [13];
  __uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_430;
  transaction<std::unique_lock<mock_mutex>_> local_428;
  undefined1 local_3f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0 [13];
  unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  undefined1 local_300 [232];
  __uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  undefined1 local_210 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_128;
  undefined1 local_118 [232];
  _Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  local_30;
  
  db = &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.db_;
  local_3f0._0_8_ =
       &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
        field_0x10;
  local_3f0[8] = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_3f0);
  local_3f0[8] = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            (&local_428,db,(unique_lock<mock_mutex> *)local_3f0);
  if (((bool)local_3f0[8] == true) && ((mutex_type *)local_3f0._0_8_ != (mutex_type *)0x0)) {
    local_3f0[8] = false;
  }
  ptVar2 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  pmVar1 = (mutex_type *)(local_3f0 + 0x10);
  local_3f0._0_8_ = pmVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"e","");
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_118,ptVar2,&local_428,(string *)local_3f0);
  if (local_30._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_30,local_30._M_head_impl);
  }
  local_30._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((mutex_type *)local_3f0._0_8_ != pmVar1) {
    operator_delete((void *)local_3f0._0_8_,local_3e0[0]._M_allocated_capacity + 1);
  }
  ptVar2 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  local_3f0._0_8_ = pmVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"f","");
  piVar6 = (iterator_base<false> *)local_3f0;
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::insert_or_assign
            ((pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
              *)local_210,ptVar2,&local_428,(string *)piVar6);
  if ((_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )local_128._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_128,local_128._M_head_impl);
  }
  local_128._M_head_impl =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  if ((mutex_type *)local_3f0._0_8_ != pmVar1) {
    operator_delete((void *)local_3f0._0_8_,local_3e0[0]._M_allocated_capacity + 1);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)local_3f0,
          (this->super_TwoValuesWithHashCollision).index_._M_t.
          super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
          ._M_head_impl,db);
  phVar3 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  memset(local_300 + 8,0,0xd8);
  local_218._M_t.
  super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (tuple<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )0x0;
  local_300._0_8_ = db;
  local_300._224_8_ = phVar3;
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>>
            (local_518,local_3f0,(iterator_base<false> *)local_300,piVar6);
  if (local_518[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_540);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)((local_510.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x42d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_558,(Message *)local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_540 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_540 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_518 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_510.internal_);
  }
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_3f0);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_518,"\"e\"","v1",(char (*) [2])0x20f308,&ppVar5->first);
  if (local_518[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_540);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)((local_510.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x430,pcVar7);
    testing::internal::AssertHelper::operator=(&local_558,(Message *)local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    if (local_540 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_540 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_518 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_510.internal_);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_3f0);
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_3f0);
  piVar6 = (iterator_base<false> *)0x20f2f2;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_518,"\"f\"","v2",(char (*) [2])0x20f2f2,&ppVar5->first);
  if (local_518[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_540);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)((local_510.internal_)->signature_)._M_elems;
    }
    piVar6 = (iterator_base<false> *)0x433;
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x433,pcVar7);
    testing::internal::AssertHelper::operator=(&local_558,(Message *)local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_540 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_540 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_518 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_510.internal_);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_3f0);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            (local_518,local_3f0,(iterator_base<false> *)local_300,piVar6);
  if (local_518[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_540);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)((local_510.internal_)->signature_)._M_elems;
    }
    piVar6 = (iterator_base<false> *)0x435;
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x435,pcVar7);
    testing::internal::AssertHelper::operator=(&local_558,(Message *)local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_540 !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_540 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_518 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_510.internal_);
  }
  phVar3 = (this->super_TwoValuesWithHashCollision).index_._M_t.
           super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .
           super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
           ._M_head_impl;
  generation = pstore::database::get_current_revision(db);
  node.internal_ = (internal_node *)&local_428;
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::flush(phVar3,(transaction_base *)node.internal_,generation);
  anon_unknown.dwarf_18e2c8::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)
             (((this->super_TwoValuesWithHashCollision).index_._M_t.
               super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
              ._M_head_impl)->root_).internal_,node);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)local_518,
          (this->super_TwoValuesWithHashCollision).index_._M_t.
          super___uniq_ptr_impl<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Head_base<0UL,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
          ._M_head_impl,db);
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator=
            ((iterator_base<false> *)local_3f0,(iterator_base<false> *)local_518);
  if ((_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )local_430._M_t.
        super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl !=
      (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_430,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_430._M_t.
                    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl);
  }
  testing::internal::
  CmpHelperNE<pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>,pstore::index::hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>::iterator_base<false>>
            (local_518,local_3f0,(iterator_base<false> *)local_300,piVar6);
  if (local_518[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_540);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)((local_510.internal_)->signature_)._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x43c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_558,(Message *)local_540);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_540 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_540 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_510.internal_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_518 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_510.internal_);
  }
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_3f0);
  pcVar4 = (ppVar5->first)._M_dataplus._M_p;
  local_518 = (undefined1  [8])(local_518 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_518,pcVar4,pcVar4 + (ppVar5->first)._M_string_length);
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)local_540,"\"e\"","v3",(char (*) [2])0x20f308,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_518);
  if (local_540[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_558);
    if (local_538 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_538->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x43f,pcVar7);
    testing::internal::AssertHelper::operator=(&local_548,(Message *)&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_548);
    if ((long *)CONCAT71(local_558.data_._1_7_,local_558.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_558.data_._1_7_,local_558.data_._0_1_) + 8))();
    }
  }
  if (local_538 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_538,local_538);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_3f0);
  ppVar5 = pstore::index::
           hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::iterator_base<false>::operator*((iterator_base<false> *)local_3f0);
  pcVar4 = (ppVar5->first)._M_dataplus._M_p;
  local_540 = (undefined1  [8])&local_530;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_540,pcVar4,pcVar4 + (ppVar5->first)._M_string_length);
  piVar6 = (iterator_base<false> *)0x20f2f2;
  testing::internal::CmpHelperEQ<char[2],std::__cxx11::string>
            ((internal *)&local_558,"\"f\"","v4",(char (*) [2])0x20f2f2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540);
  if (local_558.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_548);
    if (local_550 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_550->_M_dataplus)._M_p;
    }
    piVar6 = (iterator_base<false> *)0x442;
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x442,pcVar7);
    testing::internal::AssertHelper::operator=(&local_520,(Message *)&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    if (local_548.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_548.data_ + 8))();
    }
  }
  if (local_550 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_550,local_550);
  }
  pstore::index::
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::iterator_base<false>::operator++((iterator_base<false> *)local_3f0);
  testing::internal::EqHelper::
  Compare<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_nullptr>
            ((char *)&local_558,local_3f0,(iterator_base<false> *)local_300,piVar6);
  if (local_558.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_548);
    if (local_550 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = (local_550->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_520,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x444,pcVar7);
    testing::internal::AssertHelper::operator=(&local_520,(Message *)&local_548);
    testing::internal::AssertHelper::~AssertHelper(&local_520);
    if (local_548.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_548.data_ + 8))();
    }
  }
  if (local_550 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_550,local_550);
  }
  if (local_540 != (undefined1  [8])&local_530) {
    operator_delete((void *)local_540,local_530._M_allocated_capacity + 1);
  }
  if (local_518 != (undefined1  [8])(local_518 + 0x10)) {
    operator_delete((void *)local_518,local_508[0]._M_allocated_capacity + 1);
  }
  if (local_218._M_t.
      super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      .
      super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
      ._M_head_impl !=
      (_Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_218,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_218._M_t.
                    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl);
  }
  if ((tuple<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       )local_308._M_t.
        super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        .
        super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
        ._M_head_impl !=
      (_Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
       )0x0) {
    std::
    default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator()((default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_308,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_308._M_t.
                    super___uniq_ptr_impl<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    .
                    super__Head_base<0UL,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_false>
                    ._M_head_impl);
  }
  local_428.super_transaction_base._vptr_transaction_base = (_func_int **)&PTR__transaction_00271290
  ;
  pstore::transaction_base::rollback(&local_428.super_transaction_base);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LevelTenCollisionIterator) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "e");
    this->insert_or_assign (*index_, t1, "f");

    // Check trie iterator in the heap.
    test_trie::iterator begin = index_->begin (db_);
    test_trie::iterator end = index_->end (db_);
    EXPECT_NE (begin, end);

    std::string const & v1 = (*begin).first;
    EXPECT_EQ ("e", v1);
    ++begin;
    std::string const & v2 = (*begin).first;
    EXPECT_EQ ("f", v2);
    ++begin;
    EXPECT_EQ (begin, end);

    index_->flush (t1, db_.get_current_revision ());
    this->check_is_store_internal_node (index_->root ());

    // Check trie iterator in the store.
    begin = index_->begin (db_);
    EXPECT_NE (begin, end);

    std::string const v3 = begin->first;
    EXPECT_EQ ("e", v3);
    ++begin;
    std::string const v4 = begin->first;
    EXPECT_EQ ("f", v4);
    ++begin;
    EXPECT_EQ (begin, end);
}